

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O3

path * ghc::filesystem::temp_directory_path(void)

{
  int code;
  filesystem_error *this;
  path *in_RDI;
  error_code ec_00;
  error_code ec;
  string sStack_58;
  error_code local_38;
  
  local_38._M_value = 0;
  local_38._M_cat = (error_category *)std::_V2::system_category();
  temp_directory_path(in_RDI,&local_38);
  code = local_38._M_value;
  if (local_38._M_value == 0) {
    return in_RDI;
  }
  this = (filesystem_error *)__cxa_allocate_exception(0x90);
  detail::systemErrorText<int>(&sStack_58,code);
  ec_00._4_4_ = 0;
  ec_00._M_value = code;
  ec_00._M_cat = local_38._M_cat;
  filesystem_error::filesystem_error(this,&sStack_58,ec_00);
  __cxa_throw(this,&filesystem_error::typeinfo,filesystem_error::~filesystem_error);
}

Assistant:

GHC_INLINE path temp_directory_path()
{
    std::error_code ec;
    path result = temp_directory_path(ec);
    if (ec) {
        throw filesystem_error(detail::systemErrorText(ec.value()), ec);
    }
    return result;
}